

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O0

uint32_t helper_fpackfix(uint64_t gsr,uint64_t rs2)

{
  long local_50;
  uint local_48;
  int64_t from_fixed;
  int64_t scaled;
  int32_t src;
  uint32_t val;
  int word;
  uint32_t ret;
  int scale;
  uint64_t rs2_local;
  uint64_t gsr_local;
  
  val = 0;
  for (src = 0; src < 2; src = src + 1) {
    local_50 = ((long)(int)(rs2 >> ((byte)(src << 5) & 0x3f)) << ((byte)(gsr >> 3) & 0x1f)) >> 0x10;
    if (local_50 < -0x8000) {
      local_48 = 0xffff8000;
    }
    else {
      if (0x7fff < local_50) {
        local_50 = 0x7fff;
      }
      local_48 = (uint)local_50;
    }
    val = (local_48 & 0xffff) << ((byte)(src << 4) & 0x1f) | val;
  }
  return val;
}

Assistant:

uint32_t helper_fpackfix(uint64_t gsr, uint64_t rs2)
{
    int scale = (gsr >> 3) & 0x1f;
    uint32_t ret = 0;
    int word;

    for (word = 0; word < 2; word++) {
        uint32_t val;
        int32_t src = rs2 >> (word * 32);
        int64_t scaled = (int64_t)src << scale;
        int64_t from_fixed = scaled >> 16;

        val = (from_fixed < -32768 ? -32768 :
               from_fixed > 32767 ?  32767 : from_fixed);

        ret |= (val & 0xffff) << (word * 16);
    }

    return ret;
}